

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

size_t mpeg_bitstream_flush(mpeg_bitstream_t *packet,caption_frame_t *frame)

{
  libcaption_stauts_t lVar1;
  long in_RDI;
  cea708_t *cea708;
  
  if (*(long *)(in_RDI + 0x600030) != 0) {
    _mpeg_bitstream_cea708_front((mpeg_bitstream_t *)0x109ae7);
    lVar1 = cea708_to_caption_frame((caption_frame_t *)packet,(cea708_t *)frame);
    lVar1 = libcaption_status_update(LIBCAPTION_OK,lVar1);
    *(libcaption_stauts_t *)(in_RDI + 0x600020) = lVar1;
    *(ulong *)(in_RDI + 0x600028) = *(long *)(in_RDI + 0x600028) + 1U & 0x3f;
    *(long *)(in_RDI + 0x600030) = *(long *)(in_RDI + 0x600030) + -1;
  }
  return *(size_t *)(in_RDI + 0x600030);
}

Assistant:

size_t mpeg_bitstream_flush(mpeg_bitstream_t* packet, caption_frame_t* frame)
{
    if (packet->latent) {
        cea708_t* cea708 = _mpeg_bitstream_cea708_front(packet);
        packet->status = libcaption_status_update(LIBCAPTION_OK, cea708_to_caption_frame(frame, cea708));
        packet->front = (packet->front + 1) % MAX_REFRENCE_FRAMES;
        --packet->latent;
    }

    return packet->latent;
}